

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  char cVar3;
  http_connect_state *phVar4;
  Curl_easy *data;
  _Bool _Var5;
  byte bVar6;
  anon_enum_32 aVar7;
  int iVar8;
  CHUNKcode CVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  timediff_t tVar13;
  ulong uVar14;
  long lVar15;
  http_connect_state *phVar16;
  char *pcVar17;
  size_t size;
  char *pcVar18;
  CURLcode CVar19;
  CURLcode CVar20;
  char *pcVar21;
  Curl_easy *pCVar22;
  curl_socket_t *pcVar23;
  bool bVar24;
  Curl_send_buffer *req_buffer;
  int local_8c;
  int *local_88;
  int subversion;
  curl_off_t *local_78;
  curl_socket_t local_6c;
  Curl_easy *local_68;
  char *local_60;
  int *local_58;
  curl_socket_t *local_50;
  char *local_48;
  curl_off_t *local_40;
  ssize_t local_38;
  
  phVar16 = conn->connect_state;
  local_8c = sockindex;
  local_60 = hostname;
  if (phVar16 == (http_connect_state *)0x0) {
    phVar16 = (http_connect_state *)(*Curl_ccalloc)(1,0x4028);
    if (phVar16 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar16;
    phVar16->tunnel_state = TUNNEL_INIT;
    phVar16->keepon = 1;
    phVar16->line_start = (char *)phVar16;
    phVar16->ptr = (char *)phVar16;
    phVar16->cl = 0;
    phVar16->field_0x4024 = phVar16->field_0x4024 & 0xfd;
    phVar16 = conn->connect_state;
    subversion = 0;
    if (phVar16 != (http_connect_state *)0x0) goto LAB_004d15ce;
  }
  else {
LAB_004d15ce:
    subversion = 0;
    pcVar23 = conn->sock + local_8c;
    if (phVar16->tunnel_state != TUNNEL_COMPLETE) {
      pCVar22 = conn->data;
      local_6c = *pcVar23;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0x7f;
      local_40 = &(pCVar22->info).request_size;
      local_58 = &phVar16->perline;
      local_88 = &(pCVar22->req).httpcode;
      local_78 = &phVar16->cl;
      do {
        aVar7 = phVar16->tunnel_state;
        do {
          pcVar10 = local_60;
          if (aVar7 == TUNNEL_INIT) {
            Curl_infof(pCVar22,"Establish HTTP proxy tunnel to %s:%d\n",local_60,
                       (ulong)(uint)remote_port);
            (*Curl_cfree)((pCVar22->req).newurl);
            (pCVar22->req).newurl = (char *)0x0;
            req_buffer = Curl_add_buffer_init();
            if (req_buffer == (Curl_send_buffer *)0x0) {
LAB_004d2156:
              CVar19 = CURLE_OUT_OF_MEMORY;
            }
            else {
              local_50 = pcVar23;
              pcVar10 = curl_maprintf("%s:%d",pcVar10,(ulong)(uint)remote_port);
              CVar20 = CURLE_OUT_OF_MEMORY;
              CVar19 = CVar20;
              if (pcVar10 != (char *)0x0) {
                CVar19 = Curl_http_output_auth(conn,"CONNECT",pcVar10,true);
                (*Curl_cfree)(pcVar10);
                pcVar10 = local_60;
                if (CVar19 == CURLE_OK) {
                  pcVar21 = "1.1";
                  if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
                    pcVar21 = "1.0";
                  }
                  local_68 = pCVar22;
                  if ((conn->host).name == local_60) {
                    bVar24 = (bool)(((conn->bits).field_0x5 & 2) >> 1);
                  }
                  else {
                    pcVar11 = strchr(local_60,0x3a);
                    bVar24 = pcVar11 != (char *)0x0;
                  }
                  pcVar17 = "";
                  pcVar11 = "";
                  if (bVar24 != false) {
                    pcVar11 = "[";
                    pcVar17 = "]";
                  }
                  pcVar10 = curl_maprintf("%s%s%s:%d",pcVar11,pcVar10,pcVar17,
                                          (ulong)(uint)remote_port);
                  CVar19 = CVar20;
                  if (pcVar10 != (char *)0x0) {
                    pcVar11 = Curl_checkProxyheaders(conn,"Host");
                    if (pcVar11 == (char *)0x0) {
                      pcVar11 = curl_maprintf("Host: %s\r\n",pcVar10);
                      if (pcVar11 == (char *)0x0) {
                        (*Curl_cfree)(pcVar10);
                        goto LAB_004d2177;
                      }
                    }
                    else {
                      pcVar11 = (char *)0x0;
                    }
                    local_48 = pcVar21;
                    pcVar21 = Curl_checkProxyheaders(conn,"Proxy-Connection");
                    pcVar17 = "";
                    if (pcVar21 == (char *)0x0) {
                      pcVar17 = "Proxy-Connection: Keep-Alive\r\n";
                    }
                    pcVar12 = Curl_checkProxyheaders(conn,"User-Agent");
                    pcVar21 = "";
                    if ((pcVar12 == (char *)0x0) &&
                       (pcVar21 = "", (local_68->set).str[0x26] != (char *)0x0)) {
                      pcVar21 = (conn->allocptr).uagent;
                    }
                    pcVar12 = pcVar11;
                    if (pcVar11 == (char *)0x0) {
                      pcVar12 = "";
                    }
                    pcVar18 = (conn->allocptr).proxyuserpwd;
                    if (pcVar18 == (char *)0x0) {
                      pcVar18 = "";
                    }
                    CVar19 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar10,
                                              local_48,pcVar12,pcVar18,pcVar21,pcVar17);
                    if (pcVar11 != (char *)0x0) {
                      (*Curl_cfree)(pcVar11);
                    }
                    (*Curl_cfree)(pcVar10);
                    pCVar22 = local_68;
                    if ((CVar19 == CURLE_OK) &&
                       (CVar19 = Curl_add_custom_headers(conn,true,req_buffer), CVar19 == CURLE_OK))
                    {
                      CVar19 = Curl_add_bufferf(&req_buffer,"\r\n");
                      if (CVar19 == CURLE_OK) {
                        CVar19 = Curl_add_buffer_send(&req_buffer,conn,local_40,0,local_8c);
                        req_buffer = (Curl_send_buffer *)0x0;
                        if (CVar19 == CURLE_OK) {
                          Curl_add_buffer_free(&req_buffer);
                          phVar16->tunnel_state = TUNNEL_CONNECT;
                          phVar16->perline = 0;
                          pcVar23 = local_50;
                          goto LAB_004d190e;
                        }
                      }
                    }
                    req_buffer = (Curl_send_buffer *)0x0;
                    Curl_failf(pCVar22,"Failed sending CONNECT to proxy");
                  }
                }
              }
LAB_004d2177:
              Curl_add_buffer_free(&req_buffer);
            }
            goto LAB_004d2181;
          }
LAB_004d190e:
          tVar13 = Curl_timeleft(pCVar22,(curltime *)0x0,true);
          if (tVar13 < 1) {
            Curl_failf(pCVar22,"Proxy CONNECT aborted due to timeout");
            CVar19 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_004d2181;
          }
          _Var5 = Curl_conn_data_pending(conn,local_8c);
          if (!_Var5) goto LAB_004d15e3;
LAB_004d193a:
          do {
            while( true ) {
              if (phVar16->keepon == 0) goto LAB_004d1e9a;
              if (local_58 <= phVar16->ptr) {
                Curl_failf(pCVar22,"CONNECT response too large!");
                goto LAB_004d201b;
              }
              CVar19 = Curl_read(conn,local_6c,phVar16->ptr,1,(ssize_t *)&req_buffer);
              if (CVar19 == CURLE_AGAIN) goto LAB_004d15e3;
              iVar8 = Curl_pgrsUpdate(conn);
              if (iVar8 != 0) {
                CVar19 = CURLE_ABORTED_BY_CALLBACK;
                goto LAB_004d2181;
              }
              if (CVar19 != CURLE_OK) {
                phVar16->keepon = 0;
                goto LAB_004d1e9a;
              }
              if ((long)req_buffer < 1) {
                if (((pCVar22->set).proxyauth == 0) || ((pCVar22->state).authproxy.avail == 0)) {
                  Curl_failf(pCVar22,"Proxy CONNECT aborted");
                  bVar24 = true;
                }
                else {
                  puVar1 = &(conn->bits).field_0x6;
                  *puVar1 = *puVar1 | 0x80;
                  bVar24 = false;
                  Curl_infof(pCVar22,"Proxy CONNECT connection closed\n");
                }
                phVar16->keepon = 0;
                goto LAB_004d1e9c;
              }
              if (1 < phVar16->keepon) break;
              size = (long)phVar16->perline + 1;
              phVar16->perline = (int)size;
              if (*phVar16->ptr == '\n') {
                uVar14 = *(ulong *)&(pCVar22->set).field_0x878;
                if (((uint)uVar14 >> 0x1e & 1) != 0) {
                  Curl_debug(pCVar22,CURLINFO_HEADER_IN,phVar16->line_start,size);
                  uVar14 = *(ulong *)&(pCVar22->set).field_0x878;
                  size = (size_t)(uint)phVar16->perline;
                }
                iVar8 = (int)size;
                if ((uVar14 >> 0x31 & 1) == 0) {
                  CVar19 = Curl_client_write(conn,(((uint)uVar14 >> 0x19 & 1) != 0) + 2,
                                             phVar16->line_start,(long)iVar8);
                  if (CVar19 != CURLE_OK) goto LAB_004d2181;
                  iVar8 = *local_58;
                }
                lVar15 = (long)iVar8;
                pcVar2 = &(pCVar22->info).header_size;
                *pcVar2 = *pcVar2 + lVar15;
                pcVar2 = &(pCVar22->req).headerbytecount;
                *pcVar2 = *pcVar2 + lVar15;
                cVar3 = *phVar16->line_start;
                if ((cVar3 == '\r') || (cVar3 == '\n')) {
                  phVar16->ptr = phVar16->connect_buffer;
                  if ((*local_88 == 0x197) && (((pCVar22->state).field_0x4e4 & 0x20) == 0)) {
                    phVar16->keepon = 2;
                    if (phVar16->cl == 0) {
                      if ((phVar16->field_0x4024 & 1) == 0) goto LAB_004d1c35;
                      Curl_infof(pCVar22,"Ignore chunked response-body\n");
                      puVar1 = &(pCVar22->req).field_0x570;
                      *puVar1 = *puVar1 | 8;
                      pcVar10 = phVar16->line_start;
                      if (pcVar10[1] == '\n') {
                        pcVar10 = pcVar10 + 1;
                        phVar16->line_start = pcVar10;
                      }
                      CVar9 = Curl_httpchunk_read(conn,pcVar10 + 1,1,(ssize_t *)&req_buffer);
                      if (CVar9 == CHUNKE_STOP) {
                        Curl_infof(pCVar22,"chunk reading DONE\n");
                        phVar16->keepon = 0;
                        phVar16->tunnel_state = TUNNEL_COMPLETE;
                      }
                    }
                    else {
                      Curl_infof(pCVar22,"Ignore %ld bytes of response-body\n");
                    }
                  }
                  else {
LAB_004d1c35:
                    phVar16->keepon = 0;
                  }
                  if (*local_78 == 0) {
LAB_004d1c4f:
                    phVar16->tunnel_state = TUNNEL_COMPLETE;
                  }
                }
                else {
                  phVar16->line_start[lVar15] = '\0';
                  iVar8 = curl_strnequal("WWW-Authenticate:",phVar16->line_start,0x11);
                  if ((iVar8 == 0) || (*local_88 != 0x191)) {
                    iVar8 = curl_strnequal("Proxy-authenticate:",phVar16->line_start,0x13);
                    if ((iVar8 != 0) && (_Var5 = true, *local_88 == 0x197)) goto LAB_004d1b99;
                    iVar8 = curl_strnequal("Content-Length:",phVar16->line_start,0xf);
                    if (iVar8 == 0) {
                      _Var5 = Curl_compareheader(phVar16->line_start,"Connection:","close");
                      if (_Var5) {
LAB_004d1c81:
                        phVar16->field_0x4024 = phVar16->field_0x4024 | 2;
                      }
                      else {
                        iVar8 = curl_strnequal("Transfer-Encoding:",phVar16->line_start,0x12);
                        if (iVar8 == 0) {
                          _Var5 = Curl_compareheader(phVar16->line_start,"Proxy-Connection:","close"
                                                    );
                          if (_Var5) goto LAB_004d1c81;
                          iVar8 = __isoc99_sscanf(phVar16->line_start,"HTTP/1.%d %d",&subversion,
                                                  local_88);
                          if (iVar8 == 2) {
                            (pCVar22->info).httpproxycode = (pCVar22->req).httpcode;
                          }
                        }
                        else {
                          if (*local_88 - 200U < 100) {
                            pcVar10 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                            goto LAB_004d1c1b;
                          }
                          _Var5 = Curl_compareheader(phVar16->line_start,"Transfer-Encoding:",
                                                     "chunked");
                          if (_Var5) {
                            Curl_infof(pCVar22,"CONNECT responded chunked\n");
                            phVar16->field_0x4024 = phVar16->field_0x4024 | 1;
                            Curl_httpchunk_init(conn);
                          }
                        }
                      }
                    }
                    else if (*local_88 - 200U < 100) {
                      pcVar10 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_004d1c1b:
                      Curl_infof(pCVar22,pcVar10);
                    }
                    else {
                      curlx_strtoofft(phVar16->line_start + 0xf,(char **)0x0,10,local_78);
                    }
                  }
                  else {
                    _Var5 = false;
LAB_004d1b99:
                    pcVar10 = Curl_copy_header_value(phVar16->line_start);
                    if (pcVar10 == (char *)0x0) goto LAB_004d2156;
                    CVar19 = Curl_http_input_auth(conn,_Var5,pcVar10);
                    (*Curl_cfree)(pcVar10);
                    if (CVar19 != CURLE_OK) goto LAB_004d2181;
                  }
                  phVar16->perline = 0;
                  phVar16->ptr = phVar16->connect_buffer;
                  phVar16->line_start = phVar16->connect_buffer;
                }
              }
              else {
                phVar16->ptr = phVar16->ptr + 1;
              }
            }
            phVar16->ptr = phVar16->connect_buffer;
            lVar15 = phVar16->cl;
            if (lVar15 == 0) {
              local_38 = 0;
              CVar9 = Curl_httpchunk_read(conn,phVar16->connect_buffer,1,&local_38);
              if (CVar9 == CHUNKE_STOP) {
                Curl_infof(pCVar22,"chunk reading DONE\n");
                phVar16->keepon = 0;
                goto LAB_004d1c4f;
              }
              goto LAB_004d193a;
            }
            *local_78 = lVar15 + -1;
          } while (1 < lVar15);
          phVar16->keepon = 0;
          phVar16->tunnel_state = TUNNEL_COMPLETE;
LAB_004d1e9a:
          bVar24 = false;
LAB_004d1e9c:
          iVar8 = Curl_pgrsUpdate(conn);
          if ((bVar24) || (iVar8 != 0)) {
            CVar19 = CURLE_RECV_ERROR;
            if (iVar8 != 0) {
              CVar19 = CURLE_ABORTED_BY_CALLBACK;
            }
            goto LAB_004d2181;
          }
          if ((pCVar22->info).httpproxycode - 200U < 100) {
            bVar6 = phVar16->field_0x4024;
          }
          else {
            CVar19 = Curl_http_auth_act(conn);
            if (CVar19 != CURLE_OK) goto LAB_004d2181;
            bVar6 = phVar16->field_0x4024;
            if (((conn->bits).field_0x4 & 1) != 0) {
              bVar6 = bVar6 | 2;
              phVar16->field_0x4024 = bVar6;
            }
          }
          pcVar10 = (pCVar22->req).newurl;
          if ((bVar6 & 2) != 0) {
            if (pcVar10 != (char *)0x0) {
              Curl_closesocket(conn,*pcVar23);
              *pcVar23 = -1;
            }
            goto LAB_004d2093;
          }
          if (pcVar10 == (char *)0x0) goto LAB_004d2093;
          aVar7 = phVar16->tunnel_state;
        } while (aVar7 != TUNNEL_COMPLETE);
        phVar4 = conn->connect_state;
        phVar4->tunnel_state = TUNNEL_INIT;
        phVar4->keepon = 1;
        phVar4->line_start = phVar4->connect_buffer;
        phVar4->ptr = phVar4->connect_buffer;
        phVar4->cl = 0;
        phVar4->field_0x4024 = phVar4->field_0x4024 & 0xfd;
      } while ((pCVar22->req).newurl != (char *)0x0);
LAB_004d2093:
      if ((pCVar22->info).httpproxycode - 200U < 100) {
        phVar16->tunnel_state = TUNNEL_COMPLETE;
        (*Curl_cfree)((conn->allocptr).proxyuserpwd);
        (conn->allocptr).proxyuserpwd = (char *)0x0;
        puVar1 = &(pCVar22->state).authproxy.field_0x18;
        *puVar1 = *puVar1 | 1;
        Curl_infof(pCVar22,"Proxy replied %d to CONNECT request\n",
                   (ulong)(uint)(pCVar22->info).httpproxycode);
        puVar1 = &(pCVar22->req).field_0x570;
        *puVar1 = *puVar1 & 0xf7;
        puVar1 = &(conn->bits).field_0x6;
        *puVar1 = *puVar1 & 0xfe;
      }
      else {
        pcVar10 = (pCVar22->req).newurl;
        if (pcVar10 == (char *)0x0 || (phVar16->field_0x4024 & 2) == 0) {
          (*Curl_cfree)(pcVar10);
          (pCVar22->req).newurl = (char *)0x0;
          Curl_conncontrol(conn,2);
          Curl_closesocket(conn,*pcVar23);
          *pcVar23 = -1;
        }
        else {
          puVar1 = &(conn->bits).field_0x6;
          *puVar1 = *puVar1 | 0x80;
          Curl_infof(pCVar22,"Connect me again please\n");
          data = conn->data;
          conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
          Curl_infof(data,"CONNECT phase completed!\n");
        }
        phVar16->tunnel_state = TUNNEL_INIT;
        if (((conn->bits).field_0x6 & 0x80) == 0) {
          Curl_failf(pCVar22,"Received HTTP code %d from proxy after CONNECT",
                     (ulong)(uint)(pCVar22->req).httpcode);
LAB_004d201b:
          CVar19 = CURLE_RECV_ERROR;
          goto LAB_004d2181;
        }
      }
    }
  }
LAB_004d15e3:
  CVar19 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_004d2181:
  pCVar22 = conn->data;
  conn->connect_state->tunnel_state = TUNNEL_COMPLETE;
  Curl_infof(pCVar22,"CONNECT phase completed!\n");
  return CVar19;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}